

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

string * jwt::base::pad(string *__return_storage_ptr__,string *base,string *fill)

{
  uint uVar1;
  undefined1 local_40 [8];
  string padding;
  string *fill_local;
  string *base_local;
  
  padding.field_2._8_8_ = fill;
  std::__cxx11::string::string((string *)local_40);
  uVar1 = std::__cxx11::string::size();
  uVar1 = uVar1 & 3;
  if (uVar1 == 1) {
    std::__cxx11::string::operator+=((string *)local_40,(string *)padding.field_2._8_8_);
LAB_0010b279:
    std::__cxx11::string::operator+=((string *)local_40,(string *)padding.field_2._8_8_);
  }
  else {
    if (uVar1 == 2) goto LAB_0010b279;
    if (uVar1 != 3) goto LAB_0010b29b;
  }
  std::__cxx11::string::operator+=((string *)local_40,(string *)padding.field_2._8_8_);
LAB_0010b29b:
  std::operator+(__return_storage_ptr__,base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string pad(const std::string& base, const std::string& fill) {
			std::string padding;
			switch (base.size() % 4) {
				case 1:
					padding += fill;
					JWT_FALLTHROUGH;
				case 2:
					padding += fill;
					JWT_FALLTHROUGH;
				case 3:
					padding += fill;
					JWT_FALLTHROUGH;
				default:
					break;
			}

			return base + padding;
		}